

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall capnp::_::RpcSystemBase::Impl::~Impl(Impl *this)

{
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>,_false>_>_>
  *p_Var1;
  __buckets_ptr pp_Var2;
  long *plVar3;
  undefined8 *puVar4;
  ClientHook *pCVar5;
  Disposer *pDVar6;
  __node_ptr __n;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>,_false>_>_>
  *this_00;
  _Hash_node_base local_18;
  
  __n = (__node_ptr)&stack0xffffffffffffffe8;
  local_18._M_nxt = (_Hash_node_base *)this;
  kj::UnwindDetector::
  catchExceptionsIfUnwinding<capnp::_::RpcSystemBase::Impl::~Impl()::_lambda()_1_>
            (&this->unwindDetector,(anon_class_8_1_8991fb9c_for_func *)&stack0xffffffffffffffe8);
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>,_false>_>_>
             *)(this->connections)._M_h._M_before_begin._M_nxt;
  while (this_00 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>,_false>_>_>
          *)0x0) {
    p_Var1 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>,_false>_>_>
               **)this_00;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>,_false>_>_>
    ::_M_deallocate_node(this_00,__n);
    this_00 = p_Var1;
  }
  memset((this->connections)._M_h._M_buckets,0,(this->connections)._M_h._M_bucket_count << 3);
  (this->connections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connections)._M_h._M_element_count = 0;
  pp_Var2 = (this->connections)._M_h._M_buckets;
  if (&(this->connections)._M_h._M_single_bucket != pp_Var2) {
    operator_delete(pp_Var2,(this->connections)._M_h._M_bucket_count << 3);
  }
  kj::TaskSet::~TaskSet(&this->tasks);
  if (((this->gateway).ptr.isSet == true) &&
     (plVar3 = *(long **)((long)&(this->gateway).ptr.field_1 + 0x10), plVar3 != (long *)0x0)) {
    *(undefined8 *)((long)&(this->gateway).ptr.field_1 + 0x10) = 0;
    puVar4 = *(undefined8 **)((long)&(this->gateway).ptr.field_1 + 8);
    (**(code **)*puVar4)(puVar4,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (((this->bootstrapInterface).ptr.isSet == true) &&
     (pCVar5 = (this->bootstrapInterface).ptr.field_1.value.hook.ptr, pCVar5 != (ClientHook *)0x0))
  {
    (this->bootstrapInterface).ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    pDVar6 = (this->bootstrapInterface).ptr.field_1.value.hook.disposer;
    (**pDVar6->_vptr_Disposer)
              (pDVar6,pCVar5->_vptr_ClientHook[-2] + (long)&pCVar5->_vptr_ClientHook);
  }
  return;
}

Assistant:

~Impl() noexcept(false) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // std::unordered_map doesn't like it when elements' destructors throw, so carefully
      // disassemble it.
      if (!connections.empty()) {
        kj::Vector<kj::Own<RpcConnectionState>> deleteMe(connections.size());
        kj::Exception shutdownException = KJ_EXCEPTION(FAILED, "RpcSystem was destroyed.");
        for (auto& entry: connections) {
          entry.second->disconnect(kj::cp(shutdownException));
          deleteMe.add(kj::mv(entry.second));
        }
      }
    });
  }